

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O1

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_type jVar1;
  _json_value *p_Var2;
  double dVar3;
  double dVar4;
  uchar uVar5;
  byte bVar6;
  uchar uVar7;
  byte bVar8;
  int iVar9;
  ushort **ppuVar10;
  json_value *pjVar11;
  undefined4 extraout_var_00;
  json_value *pjVar12;
  undefined7 extraout_var;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  json_value *extraout_RAX;
  json_value *extraout_RAX_00;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  uint uVar13;
  json_value *pjVar14;
  char *pcVar15;
  char *__format;
  json_value *pjVar16;
  json_value *pjVar17;
  ulong *puVar18;
  json_value *pjVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  json_value *pjVar23;
  _json_value *p_Var24;
  bool bVar25;
  json_value *root;
  char error [128];
  long local_168;
  json_value *local_160;
  json_value *local_158;
  json_value *local_150;
  json_state local_148;
  json_value *local_e8;
  json_value *local_e0;
  json_value *local_d8;
  char *local_d0;
  json_value *local_c8;
  json_value *local_c0;
  ulong local_b8;
  undefined2 uStack_b0;
  undefined6 uStack_ae;
  undefined2 uStack_a8;
  char acStack_a6 [118];
  
  local_150 = (json_value *)0x0;
  local_148.cur_line = 0;
  local_148.cur_col = 0;
  local_148.used_memory = 0;
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  local_b8 = local_b8 & 0xffffffffffffff00;
  local_148.settings.max_memory = settings->max_memory;
  local_148.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_148.settings.memory_alloc = settings->memory_alloc;
  local_148.settings.memory_free = settings->memory_free;
  local_148.settings.user_data = settings->user_data;
  local_148.settings.value_extra = settings->value_extra;
  if (local_148.settings.memory_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_148.settings.memory_alloc = default_alloc;
  }
  pjVar19 = (json_value *)((long)&((json_value *)json)->parent + length);
  if (local_148.settings.memory_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_148.settings.memory_free = default_free;
  }
  local_148.uint_max = 0xfffffff7;
  local_148._12_4_ = 0;
  local_148.ulong_max = 0xfffffffffffffff7;
  local_c0 = (json_value *)((long)&pjVar19[-1]._reserved + 7);
  local_148._72_8_ = 1;
  local_e0 = (json_value *)0x0;
  local_e8 = (json_value *)0x0;
  local_168 = 0;
  local_d0 = error_buf;
  local_c8 = (json_value *)json;
LAB_0013ccc9:
  pjVar11 = (json_value *)0x0;
  local_158 = (json_value *)0x0;
  local_160 = (json_value *)0x0;
  local_148.cur_line = 1;
  pjVar17 = (json_value *)0x8;
  p_Var24 = (_json_value *)0x0;
  uVar20 = 0;
  pjVar16 = local_c8;
  do {
    pjVar14 = local_160;
    if (pjVar16 == pjVar19) {
      pjVar12 = (json_value *)0x0;
    }
    else {
      pjVar12 = (json_value *)(ulong)*(byte *)&pjVar16->parent;
    }
    bVar6 = (byte)pjVar12;
    uVar13 = (uint)pjVar12;
    local_148.ptr = (char *)pjVar16;
    if (((ulong)pjVar17 & 0x20) == 0) {
LAB_0013cd0f:
      uVar22 = (uint)pjVar17;
      if ((local_148.settings._8_8_ & 1) != 0) {
        if (((ulong)pjVar17 & 0x6000) != 0) {
          if ((uVar22 >> 0xd & 1) == 0) {
            if ((uVar22 >> 0xe & 1) == 0) goto LAB_0013cd1a;
            uVar22 = 7;
            if (bVar6 == 0x2a) {
              pjVar11 = pjVar16;
              if ((pjVar16 < local_c0) && (*(char *)((long)&pjVar16->parent + 1) == '/')) {
                pjVar11 = (json_value *)((long)&pjVar16->parent + 1);
                pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffff9fff);
                local_148.ptr = (char *)pjVar11;
              }
            }
            else {
              pjVar11 = pjVar12;
              if (uVar13 == 0) {
                pcVar15 = "%d:%d: Unexpected EOF in block comment";
                goto LAB_0013ce7e;
              }
            }
          }
          else {
            uVar22 = 7;
            if ((bVar6 < 0xe) && (pjVar11 = pjVar12, (0x2401U >> (uVar13 & 0x1f) & 1) != 0)) {
              pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffdfff);
              local_148.ptr = (char *)((long)&pjVar16[-1]._reserved + 7);
            }
          }
          goto LAB_0013dcad;
        }
        if (bVar6 != 0x2f) goto LAB_0013cd1a;
        if ((((ulong)pjVar17 & 0x88) == 0) && (local_160->type != json_object)) {
          pcVar15 = "%d:%d: Comment not allowed here";
        }
        else {
          local_148.ptr = (char *)((long)&pjVar16->parent + 1);
          if ((json_value *)local_148.ptr != pjVar19) {
            bVar6 = *(byte *)&((json_value *)local_148.ptr)->parent;
            pjVar12 = (json_value *)(ulong)bVar6;
            if (bVar6 == 0x2a) {
              pjVar17 = (json_value *)((ulong)pjVar17 | 0x4000);
            }
            else {
              if (bVar6 != 0x2f) {
                uVar21 = (ulong)(uint)(int)(char)bVar6;
                pcVar15 = "%d:%d: Unexpected `%c` in comment opening sequence";
                goto LAB_0013d816;
              }
              pjVar17 = (json_value *)((ulong)pjVar17 | 0x2000);
            }
            goto LAB_0013dca7;
          }
          pcVar15 = "%d:%d: EOF unexpected";
        }
LAB_0013ce7e:
        iVar9 = snprintf((char *)&local_b8,0x80,pcVar15,local_148._88_8_ & 0xffffffff,
                         (ulong)local_148.cur_col);
        pjVar11 = (json_value *)CONCAT44(extraout_var_00,iVar9);
LAB_0013ce8b:
        uVar22 = 8;
        goto LAB_0013dcad;
      }
LAB_0013cd1a:
      if ((char)pjVar17 < '\0') {
        if (uVar13 < 10) {
          uVar22 = 5;
          pjVar11 = pjVar12;
          if (uVar13 == 0) goto LAB_0013dcad;
          if (uVar13 != 9) goto LAB_0013d020;
        }
        else if ((uVar13 != 0x20) && (uVar13 != 0xd)) {
          if (uVar13 != 10) {
LAB_0013d020:
            uVar21 = (ulong)(uint)(int)(char)bVar6;
            pcVar15 = "%d:%d: Trailing garbage: `%c`";
LAB_0013d816:
            iVar9 = snprintf((char *)&local_b8,0x80,pcVar15,local_148._88_8_ & 0xffffffff,
                             (ulong)local_148.cur_col,uVar21);
            pjVar11 = (json_value *)CONCAT44(extraout_var_04,iVar9);
            goto LAB_0013ce8b;
          }
          local_148.cur_col = 0;
          local_148.cur_line = local_148.cur_line + 1;
        }
        goto LAB_0013dca7;
      }
      if (((ulong)pjVar17 & 8) != 0) {
        uVar22 = 7;
        if (uVar13 < 0xd) {
          pjVar11 = pjVar12;
          if (uVar13 != 9) {
            if (uVar13 != 10) goto LAB_0013d1a1;
LAB_0013d0b3:
            uVar22 = 7;
            local_148.cur_col = 0;
            local_148.cur_line = local_148.cur_line + 1;
            pjVar11 = pjVar12;
          }
        }
        else {
          pjVar11 = pjVar12;
          if ((uVar13 != 0xd) && (uVar13 != 0x20)) {
            if (uVar13 == 0x5d) {
              if ((local_160 == (json_value *)0x0) ||
                 (pjVar12 = local_160, local_160->type != json_array)) {
                pcVar15 = "%d:%d: Unexpected ]";
                goto LAB_0013ce7e;
              }
LAB_0013d59d:
              pjVar17 = (json_value *)(((ulong)pjVar17 & 0xffffffffffffff72) + 1);
              pjVar11 = pjVar12;
              goto LAB_0013d8e9;
            }
LAB_0013d1a1:
            if (((ulong)pjVar17 & 4) == 0) {
              if (((ulong)pjVar17 & 0x40) == 0) {
                pjVar14 = (json_value *)((ulong)pjVar17 & 0xffffffffffffff33);
                if (0x6d < uVar13) {
                  if (uVar13 == 0x6e) {
                    if ((((2 < (long)pjVar19 - (long)pjVar16) &&
                         (local_148.ptr = (char *)((long)&pjVar16->parent + 1),
                         *(char *)((long)&pjVar16->parent + 1) == 'u')) &&
                        (local_148.ptr = (char *)((long)&pjVar16->parent + 2),
                        *(char *)((long)&pjVar16->parent + 2) == 'l')) &&
                       (local_148.ptr = (char *)((long)&pjVar16->parent + 3),
                       *(char *)((long)&pjVar16->parent + 3) == 'l')) {
                      iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_null);
                      pjVar11 = (json_value *)CONCAT44(extraout_var_08,iVar9);
                      if (iVar9 != 0) goto LAB_0013dc2f;
LAB_0013df76:
                      uVar22 = 0x20;
                      pjVar17 = pjVar14;
                      goto LAB_0013dcad;
                    }
                  }
                  else {
                    if (uVar13 != 0x74) {
                      if (uVar13 != 0x7b) goto LAB_0013db0c;
                      iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_object);
                      bVar25 = iVar9 == 0;
                      pjVar17 = pjVar14;
                      goto LAB_0013db92;
                    }
                    if (((2 < (long)pjVar19 - (long)pjVar16) &&
                        (local_148.ptr = (char *)((long)&pjVar16->parent + 1),
                        *(char *)((long)&pjVar16->parent + 1) == 'r')) &&
                       ((local_148.ptr = (char *)((long)&pjVar16->parent + 2),
                        *(char *)((long)&pjVar16->parent + 2) == 'u' &&
                        (local_148.ptr = (char *)((long)&pjVar16->parent + 3),
                        *(char *)((long)&pjVar16->parent + 3) == 'e')))) {
                      iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_boolean);
                      pjVar11 = (json_value *)CONCAT44(extraout_var_10,iVar9);
                      if (iVar9 == 0) goto LAB_0013df76;
                      (local_160->u).boolean = 1;
                      pjVar11 = local_160;
LAB_0013dc2f:
                      pjVar17 = (json_value *)((ulong)pjVar14 | 1);
                      goto LAB_0013d8e9;
                    }
                  }
                  uVar22 = 0x21;
                  pjVar11 = pjVar16;
                  pjVar17 = pjVar14;
                  goto LAB_0013dcad;
                }
                if (uVar13 == 0x22) {
                  iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_string);
                  if (iVar9 == 0) {
                    uVar22 = 0x20;
                    pjVar11 = (json_value *)CONCAT44(extraout_var_07,iVar9);
                    pjVar17 = pjVar14;
                  }
                  else {
                    p_Var24 = (_json_value *)(local_160->u).object.values;
                    uVar20 = 0;
                    pjVar11 = local_160;
                    pjVar17 = (json_value *)((ulong)pjVar14 | 0x20);
                  }
                  goto LAB_0013dcad;
                }
                if (uVar13 == 0x5b) {
                  iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_array);
                  bVar25 = iVar9 == 0;
                  if (bVar25) {
                    pjVar17 = pjVar14;
                  }
LAB_0013db92:
                  uVar22 = 7;
                  pjVar11 = (json_value *)0x20;
                  if (bVar25) {
                    uVar22 = 0x20;
                  }
                  goto LAB_0013dcad;
                }
                if (uVar13 == 0x66) {
                  uVar22 = 0x21;
                  pjVar11 = pjVar16;
                  pjVar17 = pjVar14;
                  if (((3 < (long)pjVar19 - (long)pjVar16) &&
                      (local_148.ptr = (char *)((long)&pjVar16->parent + 1),
                      *(char *)((long)&pjVar16->parent + 1) == 'a')) &&
                     ((local_148.ptr = (char *)((long)&pjVar16->parent + 2),
                      *(char *)((long)&pjVar16->parent + 2) == 'l' &&
                      ((local_148.ptr = (char *)((long)&pjVar16->parent + 3),
                       *(char *)((long)&pjVar16->parent + 3) == 's' &&
                       (local_148.ptr = (char *)((long)&pjVar16->parent + 4),
                       *(char *)((long)&pjVar16->parent + 4) == 'e')))))) {
                    iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_boolean);
                    pjVar11 = (json_value *)CONCAT44(extraout_var_13,iVar9);
                    if (iVar9 != 0) {
                      pjVar17 = (json_value *)((ulong)pjVar14 | 1);
                      goto LAB_0013d8e9;
                    }
                    uVar22 = 0x20;
                  }
                  goto LAB_0013dcad;
                }
LAB_0013db0c:
                ppuVar10 = __ctype_b_loc();
                if (((*(byte *)((long)*ppuVar10 + (long)(char)bVar6 * 2 + 1) & 8) == 0) &&
                   (bVar6 != 0x2d)) {
                  iVar9 = snprintf((char *)&local_b8,0x80,"%d:%d: Unexpected %c when seeking value",
                                   local_148._88_8_ & 0xffffffff,(ulong)local_148._88_8_ >> 0x20,
                                   (ulong)(uint)(int)(char)bVar6);
                  uVar22 = 8;
                  pjVar11 = (json_value *)CONCAT44(extraout_var_09,iVar9);
                  pjVar17 = pjVar14;
                  goto LAB_0013dcad;
                }
                iVar9 = new_value(&local_148,&local_160,&local_158,&local_150,json_integer);
                pjVar11 = (json_value *)CONCAT44(extraout_var_12,iVar9);
                if (iVar9 == 0) {
                  uVar22 = 0x20;
                  pjVar17 = pjVar14;
                  goto LAB_0013dcad;
                }
                if (local_148.first_pass == 0) {
                  while (((((*ppuVar10)[(char)pjVar12] >> 0xb & 1) != 0 ||
                          ((uVar13 = (int)pjVar12 - 0x2b, pjVar11 = (json_value *)(ulong)uVar13,
                           uVar13 < 0x3b &&
                           ((0x40000000400000dU >> ((ulong)pjVar11 & 0x3f) & 1) != 0)))) &&
                         (pjVar11 = (json_value *)((long)(_json_value **)local_148.ptr + 1),
                         local_148.ptr = (char *)pjVar11, pjVar11 != pjVar19))) {
                    pjVar12 = (json_value *)(ulong)*(byte *)&pjVar11->parent;
                  }
                  pjVar17 = (json_value *)((ulong)pjVar14 | 3);
                }
                else {
                  if (bVar6 == 0x2d) {
                    local_168 = 0;
                    local_e8 = (json_value *)0x0;
                    local_e0 = (json_value *)0x0;
                    pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffe033 | 0x100);
                    goto LAB_0013dcad;
                  }
                  pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffe033 | 2);
                  local_168 = 0;
                  local_e8 = (json_value *)0x0;
                  local_e0 = (json_value *)0x0;
                }
                goto LAB_0013d8e9;
              }
              if (bVar6 != 0x3a) {
                pcVar15 = "%d:%d: Expected : before %c";
                goto LAB_0013d8b8;
              }
              pjVar11 = pjVar12;
              pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffff3b);
            }
            else {
              if (bVar6 != 0x2c) {
                pcVar15 = "%d:%d: Expected , before %c";
LAB_0013d8b8:
                iVar9 = snprintf((char *)&local_b8,0x80,pcVar15,local_148._88_8_ & 0xffffffff,
                                 (ulong)local_148.cur_col,(ulong)(uint)(int)(char)bVar6);
                pjVar11 = (json_value *)CONCAT44(extraout_var_05,iVar9);
                goto LAB_0013ce8b;
              }
              pjVar11 = pjVar12;
              pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffff7b);
            }
          }
        }
        goto LAB_0013dcad;
      }
      jVar1 = local_160->type;
      if (1 < jVar1 - json_integer) {
        pjVar11 = (json_value *)(ulong)(jVar1 - json_integer);
        if (jVar1 != json_object) goto LAB_0013d8e9;
        uVar22 = 7;
        if (0x1f < uVar13) {
          if (uVar13 < 0x2c) {
            pjVar11 = pjVar12;
            if (uVar13 == 0x20) goto LAB_0013dcad;
            if (uVar13 == 0x22) {
              if (((ulong)pjVar17 & 4) != 0) {
                pcVar15 = "%d:%d: Expected , before \"";
                goto LAB_0013ce7e;
              }
              pjVar17 = (json_value *)((ulong)pjVar17 | 0x20);
              p_Var24 = (local_160->_reserved).next_alloc;
              uVar20 = 0;
              goto LAB_0013d8e9;
            }
          }
          else if (uVar13 == 0x2c) {
            if (((ulong)pjVar17 & 4) != 0) {
              pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffff73);
              pjVar11 = pjVar12;
              goto LAB_0013d8e9;
            }
          }
          else if (uVar13 == 0x7d) goto LAB_0013d59d;
LAB_0013d7ec:
          uVar21 = (ulong)(uint)(int)(char)bVar6;
          pcVar15 = "%d:%d: Unexpected `%c` in object";
          goto LAB_0013d816;
        }
        pjVar11 = pjVar12;
        if (uVar13 != 9) {
          if (uVar13 == 10) goto LAB_0013d0b3;
          if (uVar13 != 0xd) goto LAB_0013d7ec;
        }
        goto LAB_0013dcad;
      }
      ppuVar10 = __ctype_b_loc();
      if ((*(byte *)((long)*ppuVar10 + (long)(char)bVar6 * 2 + 1) & 8) != 0) {
        iVar9 = (int)(char)bVar6;
        if ((jVar1 == json_integer) || (((ulong)pjVar17 & 0x400) != 0)) {
          if ((uVar22 >> 10 & 1) == 0) {
            if ((uVar22 >> 9 & 1) != 0) {
              iVar9 = snprintf((char *)&local_b8,0x80,"%d:%d: Unexpected `0` before `%c`",
                               local_148._88_8_ & 0xffffffff,(ulong)local_148.cur_col);
              pjVar11 = (json_value *)CONCAT44(extraout_var_03,iVar9);
              uVar22 = 8;
              local_168 = local_168 + 1;
              goto LAB_0013dcad;
            }
            pjVar11 = (json_value *)((ulong)pjVar17 | 0x200);
            if (bVar6 != 0x30) {
              pjVar11 = pjVar17;
            }
            if (local_168 == 0) {
              pjVar17 = pjVar11;
            }
            pjVar11 = (json_value *)(((long)iVar9 + (pjVar14->u).integer * 10) - 0x30);
            (pjVar14->u).integer = (int64_t)pjVar11;
          }
          else {
            pjVar17 = (json_value *)((ulong)pjVar17 | 0x800);
            pjVar11 = (json_value *)(((long)iVar9 + (long)local_e8 * 10) - 0x30);
            local_e8 = pjVar11;
          }
        }
        else {
          pjVar11 = (json_value *)(((long)iVar9 + (long)local_e0 * 10) - 0x30);
          local_e0 = pjVar11;
        }
        uVar22 = 7;
        local_168 = local_168 + 1;
        goto LAB_0013dcad;
      }
      if (bVar6 == 0x2b) {
LAB_0013cd81:
        pjVar12 = (json_value *)(ulong)(uVar22 & 0xc00);
        if ((uVar22 & 0xc00) == 0x400) {
          pjVar11 = (json_value *)((ulong)(bVar6 == 0x2d) << 0xc | (ulong)pjVar17 | 0x800);
          uVar22 = 7;
          pjVar17 = pjVar11;
          goto LAB_0013dcad;
        }
LAB_0013d5f8:
        if ((uVar22 >> 10 & 1) == 0) {
          if (jVar1 == json_double) {
            if (local_168 == 0) {
              pcVar15 = "%d:%d: Expected digit after `.`";
              goto LAB_0013d9ef;
            }
            dVar3 = (double)(long)local_e0;
            dVar4 = pow(10.0,(double)local_168);
            (pjVar14->u).dbl = dVar3 / dVar4 + (pjVar14->u).dbl;
            pjVar12 = extraout_RAX;
          }
          if ((bVar6 & 0xdf) == 0x45) {
            if (pjVar14->type == json_integer) {
              pjVar14->type = json_double;
              (pjVar14->u).dbl = (double)(pjVar14->u).integer;
            }
            pjVar17 = (json_value *)((ulong)pjVar17 & 0xfffffffffffff977 | 0x400);
LAB_0013da24:
            uVar22 = 7;
            goto LAB_0013da2a;
          }
        }
        else {
          if (local_168 == 0) {
            pcVar15 = "%d:%d: Expected digit after `e`";
LAB_0013d9ef:
            iVar9 = snprintf((char *)&local_b8,0x80,pcVar15,local_148._88_8_ & 0xffffffff,
                             (ulong)local_148.cur_col);
            uVar22 = 8;
            local_168 = 0;
            pjVar11 = (json_value *)CONCAT44(extraout_var_06,iVar9);
            goto LAB_0013dcad;
          }
          pjVar11 = (json_value *)-(long)local_e8;
          if ((uVar22 >> 0xc & 1) == 0) {
            pjVar11 = local_e8;
          }
          dVar3 = pow(10.0,(double)(long)pjVar11);
          (pjVar14->u).dbl = dVar3 * (pjVar14->u).dbl;
          pjVar12 = extraout_RAX_00;
        }
        if ((uVar22 >> 8 & 1) != 0) {
          if (pjVar14->type == json_integer) {
            (pjVar14->u).integer = -(pjVar14->u).integer;
          }
          else {
            (pjVar14->u).integer = (pjVar14->u).integer ^ 0x8000000000000000;
          }
        }
        pjVar17 = (json_value *)((ulong)pjVar17 | 3);
        pjVar11 = pjVar12;
LAB_0013d8e9:
        if (((ulong)pjVar17 & 2) != 0) {
          pjVar17 = (json_value *)((ulong)pjVar17 & 0xfffffffffffffffd);
          local_148.ptr =
               (char *)((long)&((json_value *)((long)local_148.ptr + -0x28))->_reserved + 7);
        }
        uVar22 = 0;
        if (((ulong)pjVar17 & 1) != 0) {
          p_Var2 = local_160->parent;
          if (p_Var2 == (_json_value *)0x0) {
            pjVar17 = (json_value *)((ulong)pjVar17 & 0xfffffffffffffffa | 0x84);
            pjVar12 = local_160;
            goto LAB_0013dca7;
          }
          jVar1 = p_Var2->type;
          if (local_148.first_pass == 0) {
            if (jVar1 == json_array) {
              puVar18 = (ulong *)((p_Var2->u).string.ptr + (ulong)(p_Var2->u).string.length * 8);
            }
            else {
              if (jVar1 != json_object) goto LAB_0013d964;
              puVar18 = (ulong *)((p_Var2->u).string.ptr +
                                 (ulong)(p_Var2->u).string.length * 0x18 + 0x10);
            }
            *puVar18 = (ulong)local_160;
          }
LAB_0013d964:
          pjVar17 = (json_value *)
                    ((ulong)pjVar17 & 0xfffffffffffffffa | (ulong)(jVar1 == json_array) << 3 | 4);
          uVar13 = (local_160->parent->u).boolean + 1;
          (local_160->parent->u).string.length = uVar13;
          uVar22 = 9;
          pjVar11 = local_160;
          if (uVar13 <= local_148.uint_max) {
            local_160 = local_160->parent;
            pjVar12 = local_160;
            goto LAB_0013dca7;
          }
        }
      }
      else {
        if (uVar13 != 0x2e) {
          if (uVar13 == 0x2d) goto LAB_0013cd81;
          goto LAB_0013d5f8;
        }
        if (jVar1 != json_integer) goto LAB_0013d5f8;
        if (local_168 != 0) {
          pjVar14->type = json_double;
          (pjVar14->u).dbl = (double)(pjVar14->u).integer;
          goto LAB_0013da24;
        }
        iVar9 = snprintf((char *)&local_b8,0x80,"%d:%d: Expected digit before `.`",
                         local_148._88_8_ & 0xffffffff,(ulong)local_148.cur_col);
        pjVar12 = (json_value *)CONCAT44(extraout_var_02,iVar9);
        uVar22 = 8;
LAB_0013da2a:
        local_168 = 0;
        pjVar11 = pjVar12;
      }
    }
    else {
      if (bVar6 == 0) {
        pcVar15 = "Unexpected EOF in string (at %d:%d)";
        goto LAB_0013ce7e;
      }
      uVar22 = 9;
      if (local_148.uint_max < uVar20) goto LAB_0013dcad;
      pjVar23 = pjVar12;
      if (((ulong)pjVar17 & 0x10) == 0) {
        if (bVar6 == 0x22) {
          if (local_148.first_pass == 0) {
            *(undefined1 *)((long)&p_Var24->parent + (ulong)uVar20) = 0;
          }
          pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffffcf);
          if (local_160->type != json_object) {
            if (local_160->type == json_string) {
              (local_160->u).string.length = uVar20;
              pjVar17 = (json_value *)((ulong)pjVar17 | 1);
            }
            p_Var24 = (_json_value *)0x0;
            pjVar11 = local_160;
            goto LAB_0013cd0f;
          }
          if (local_148.first_pass == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((local_160->u).string.ptr + (ulong)(local_160->u).string.length * 0x18) =
                 local_160->_reserved;
            pjVar11 = (json_value *)&local_160->_reserved;
            (local_160->u).object.values[(local_160->u).string.length].name_length = uVar20;
          }
          else {
            pjVar11 = (json_value *)((long)&local_160->u + 8);
          }
          ((anon_union_8_2_291a86ad_for__reserved *)&pjVar11->parent)->next_alloc =
               (_json_value *)
               ((long)&((anon_union_8_2_291a86ad_for__reserved *)&pjVar11->parent)->next_alloc->
                       parent + (ulong)(uVar20 + 1));
          uVar22 = 7;
          p_Var24 = (_json_value *)0x0;
          pjVar17 = (json_value *)((ulong)pjVar17 | 0x48);
          goto LAB_0013dcad;
        }
        if (uVar13 == 0x5c) {
          pjVar17 = (json_value *)((ulong)pjVar17 | 0x10);
          goto LAB_0013dca7;
        }
switchD_0013cfef_caseD_6f:
        if (local_148.first_pass == 0) {
          *(char *)((long)&((json_value *)(ulong)uVar20)->parent + (long)&p_Var24->parent) =
               (char)pjVar23;
          pjVar12 = (json_value *)(ulong)uVar20;
        }
        goto LAB_0013dca4;
      }
      pjVar17 = (json_value *)((ulong)pjVar17 & 0xffffffffffffffef);
      if (7 < uVar13 - 0x6e) {
        if (uVar13 == 0x66) {
          if (local_148.first_pass == 0) {
            *(undefined1 *)((long)&((json_value *)(ulong)uVar20)->parent + (long)&p_Var24->parent) =
                 0xc;
            pjVar12 = (json_value *)(ulong)uVar20;
          }
        }
        else {
          if (uVar13 != 0x62) goto switchD_0013cfef_caseD_6f;
          if (local_148.first_pass == 0) {
            *(undefined1 *)((long)&((json_value *)(ulong)uVar20)->parent + (long)&p_Var24->parent) =
                 8;
            pjVar12 = (json_value *)(ulong)uVar20;
          }
        }
        goto LAB_0013dca4;
      }
      pjVar12 = (json_value *)
                ((long)&switchD_0013cfef::switchdataD_00147e48 +
                (long)(int)(&switchD_0013cfef::switchdataD_00147e48)[uVar13 - 0x6e]);
      switch(uVar13) {
      case 0x6e:
        if (local_148.first_pass == 0) {
          pjVar12 = (json_value *)(ulong)uVar20;
          *(undefined1 *)((long)&pjVar12->parent + (long)&p_Var24->parent) = 10;
        }
        break;
      default:
        goto switchD_0013cfef_caseD_6f;
      case 0x72:
        if (local_148.first_pass == 0) {
          *(undefined1 *)((long)&((json_value *)(ulong)uVar20)->parent + (long)&p_Var24->parent) =
               0xd;
          pjVar12 = (json_value *)(ulong)uVar20;
        }
        break;
      case 0x74:
        if (local_148.first_pass == 0) {
          *(undefined1 *)((long)&((json_value *)(ulong)uVar20)->parent + (long)&p_Var24->parent) = 9
          ;
          pjVar12 = (json_value *)(ulong)uVar20;
        }
        break;
      case 0x75:
        if ((long)pjVar19 - (long)pjVar16 < 4) {
LAB_0013d48b:
          iVar9 = snprintf((char *)&local_b8,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                           local_148._88_8_ & 0xffffffff,(ulong)local_148._88_8_ >> 0x20);
          pjVar11 = (json_value *)CONCAT44(extraout_var_01,iVar9);
          uVar22 = 8;
          goto LAB_0013dcad;
        }
        local_148.ptr = (char *)((long)&pjVar16->parent + 1);
        uVar5 = hex_value(*(char *)((long)&pjVar16->parent + 1));
        if (uVar5 == 0xff) goto LAB_0013d48b;
        local_148.ptr = (char *)((long)&pjVar16->parent + 2);
        bVar6 = hex_value(*(char *)((long)&pjVar16->parent + 2));
        if (bVar6 == 0xff) goto LAB_0013d48b;
        local_148.ptr = (char *)((long)&pjVar16->parent + 3);
        uVar7 = hex_value(*(char *)((long)&pjVar16->parent + 3));
        if (uVar7 == 0xff) goto LAB_0013d48b;
        local_148.ptr = (char *)((long)&pjVar16->parent + 4);
        local_d8 = (json_value *)local_148.ptr;
        bVar8 = hex_value(*(char *)((long)&pjVar16->parent + 4));
        if (bVar8 == 0xff) goto LAB_0013d48b;
        bVar8 = bVar8 | uVar7 << 4;
        pjVar12 = (json_value *)CONCAT71(extraout_var,bVar8);
        uVar13 = (uint)CONCAT11(bVar6 | uVar5 << 4,bVar8);
        pjVar23 = (json_value *)(ulong)uVar13;
        if ((byte)(bVar6 & 0xf8 | uVar5 << 4) == 0xd8) {
          if ((((long)pjVar19 - (long)local_d8 < 6) ||
              (local_148.ptr = (char *)((long)&pjVar16->parent + 5),
              *(char *)((long)&pjVar16->parent + 5) != '\\')) ||
             (local_148.ptr = (char *)((long)&pjVar16->parent + 6),
             *(char *)((long)&pjVar16->parent + 6) != 'u')) {
LAB_0013dc47:
            bVar25 = false;
            iVar9 = snprintf((char *)&local_b8,0x80,"Invalid character value `%c` (at %d:%d)",0x75,
                             local_148._88_8_ & 0xffffffff,(ulong)local_148._88_8_ >> 0x20);
            pjVar12 = (json_value *)CONCAT44(extraout_var_11,iVar9);
            uVar22 = 8;
          }
          else {
            local_148.ptr = (char *)((long)&pjVar16->parent + 7);
            uVar5 = hex_value(*(char *)((long)&pjVar16->parent + 7));
            if (uVar5 == 0xff) goto LAB_0013dc47;
            local_148.ptr = (char *)&pjVar16->type;
            uVar5 = hex_value((char)pjVar16->type);
            local_d8 = (json_value *)CONCAT71(local_d8._1_7_,uVar5);
            if (uVar5 == 0xff) goto LAB_0013dc47;
            local_148.ptr = (char *)((long)&pjVar16->type + 1);
            uVar5 = hex_value(*(byte *)((long)&pjVar16->type + 1));
            if (uVar5 == 0xff) goto LAB_0013dc47;
            local_148.ptr = (char *)((long)&pjVar16->type + 2);
            bVar6 = hex_value(*(byte *)((long)&pjVar16->type + 2));
            if (bVar6 == 0xff) goto LAB_0013dc47;
            bVar6 = bVar6 | uVar5 << 4;
            pjVar12 = (json_value *)(ulong)bVar6;
            pjVar23 = (json_value *)
                      (ulong)((uint)bVar6 + (((byte)local_d8 & 3) << 8 | (uVar13 & 0x3bf) << 10) +
                             0x10000);
            uVar22 = 0;
            bVar25 = true;
          }
          pjVar11 = pjVar12;
          if (!bVar25) goto LAB_0013dcad;
        }
        uVar13 = (uint)pjVar23;
        if (uVar13 < 0x80) goto switchD_0013cfef_caseD_6f;
        if (uVar13 < 0x800) {
          if (local_148.first_pass == 0) {
            pjVar12 = (json_value *)((ulong)pjVar23 >> 6 | 0xc0);
            uVar13 = uVar20 + 1;
            *(char *)((long)&p_Var24->parent + (ulong)uVar20) = (char)pjVar12;
            uVar20 = uVar20 + 2;
LAB_0013df6d:
            *(byte *)((long)&p_Var24->parent + (ulong)uVar13) = (byte)pjVar23 & 0x3f | 0x80;
          }
          else {
            uVar20 = uVar20 + 2;
          }
        }
        else {
          pjVar12 = (json_value *)(local_148._72_8_ & 0xffffffff);
          if (uVar13 < 0x10000) {
            if (local_148.first_pass == 0) {
              *(byte *)((long)&p_Var24->parent + (ulong)uVar20) =
                   (byte)((ulong)pjVar23 >> 0xc) | 0xe0;
              pjVar12 = (json_value *)((ulong)pjVar23 >> 6 & 0x3ffff3f | 0x80);
              uVar13 = uVar20 + 2;
              *(char *)((long)&p_Var24->parent + (ulong)(uVar20 + 1)) = (char)pjVar12;
              uVar20 = uVar20 + 3;
              *(byte *)((long)&p_Var24->parent + (ulong)uVar13) = (byte)pjVar23 & 0x3f | 0x80;
            }
            else {
              uVar20 = uVar20 + 3;
            }
          }
          else {
            if (local_148.first_pass == 0) {
              *(byte *)((long)&p_Var24->parent + (ulong)uVar20) =
                   (byte)((ulong)pjVar23 >> 0x12) | 0xf0;
              *(byte *)((long)&p_Var24->parent + (ulong)(uVar20 + 1)) =
                   (byte)((ulong)pjVar23 >> 0xc) & 0x3f | 0x80;
              pjVar12 = (json_value *)((ulong)pjVar23 >> 6 & 0x3ffff3f | 0x80);
              uVar13 = uVar20 + 3;
              *(char *)((long)&p_Var24->parent + (ulong)(uVar20 + 2)) = (char)pjVar12;
              uVar20 = uVar20 + 4;
              goto LAB_0013df6d;
            }
            uVar20 = uVar20 + 4;
          }
        }
        goto LAB_0013dca7;
      }
LAB_0013dca4:
      uVar20 = uVar20 + 1;
LAB_0013dca7:
      uVar22 = 7;
      pjVar11 = pjVar12;
    }
LAB_0013dcad:
    pcVar15 = local_d0;
    if ((uVar22 != 0) && (uVar22 != 7)) break;
    pjVar16 = (json_value *)((long)(_json_value **)local_148.ptr + 1);
  } while( true );
  if (uVar22 == 5) {
    local_150 = local_158;
    uVar22 = 0;
    pjVar11 = local_158;
  }
  if (uVar22 == 0) {
    iVar9 = local_148.first_pass;
    local_148.first_pass = local_148.first_pass + -1;
    if (iVar9 < 1) {
      return local_158;
    }
    goto LAB_0013ccc9;
  }
  if (uVar22 < 0x20) {
    if (uVar22 == 8) goto LAB_0013e06c;
    if (uVar22 != 9) {
      return pjVar11;
    }
    __format = "%d:%d: Too long (caught overflow)";
  }
  else {
    if (uVar22 == 0x20) {
      uStack_a8 = 0x206e;
      builtin_strncpy(acStack_a6,"failure",8);
      local_b8._0_1_ = 'M';
      local_b8._1_1_ = 'e';
      local_b8._2_1_ = 'm';
      local_b8._3_1_ = 'o';
      local_b8._4_1_ = 'r';
      local_b8._5_1_ = 'y';
      local_b8._6_1_ = ' ';
      local_b8._7_1_ = 'a';
      uStack_b0 = 0x6c6c;
      uStack_ae = 0x6f697461636f;
      goto LAB_0013e06c;
    }
    if (uVar22 != 0x21) {
      return pjVar11;
    }
    __format = "%d:%d: Unknown value";
  }
  snprintf((char *)&local_b8,0x80,__format,local_148._88_8_ & 0xffffffff,
           (ulong)local_148._88_8_ >> 0x20);
LAB_0013e06c:
  if (pcVar15 != (char *)0x0) {
    if ((char)local_b8 == '\0') {
      builtin_strncpy(pcVar15,"Unknown error",0xe);
    }
    else {
      strcpy(pcVar15,(char *)&local_b8);
    }
  }
  if (local_148.first_pass != 0) {
    local_150 = local_158;
  }
  pjVar19 = local_150;
  if (local_150 != (json_value *)0x0) {
    do {
      p_Var24 = (pjVar19->_reserved).next_alloc;
      (*local_148.settings.memory_free)(pjVar19,local_148.settings.user_data);
      pjVar19 = p_Var24;
    } while (p_Var24 != (_json_value *)0x0);
    local_160 = (json_value *)0x0;
  }
  local_150 = (json_value *)0x0;
  if (local_148.first_pass == 0) {
    json_value_free_ex(&local_148.settings,local_158);
  }
  return (json_value *)0x0;
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value *top, *root = NULL, * alloc = 0;
   json_state state = EMPTY_STATE_STRUCT;
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.memory_alloc)
      state.settings.memory_alloc = default_alloc;

   if (!state.settings.memory_free)
      state.settings.memory_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);

         if (flags & flag_string)
         {
            if (!b)
            {  snprintf (error, sizeof(error), "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr < 4 ||
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;

                        if (end - state.ptr < 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;

                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  snprintf (error, sizeof(error), "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  snprintf (error, sizeof(error), "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  snprintf (error, sizeof(error), "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:

               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;

                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;

            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   snprintf (error, sizeof(error), "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   snprintf (error, sizeof(error), "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.memory_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}